

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::SPxLPBase<double>::changeLhs(SPxLPBase<double> *this,int i,double *newLhs,bool scale)

{
  double dVar1;
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  double dVar2;
  
  dVar1 = *newLhs;
  dVar2 = dVar1;
  if ((int)CONCAT71(in_register_00000009,scale) != 0) {
    ::soplex::infinity::__tls_init();
    dVar2 = *newLhs;
    if (-*(double *)(in_FS_OFFSET + -8) < dVar1) {
      (*this->lp_scaler->_vptr_SPxScaler[0x2d])(this->lp_scaler,this,i);
      dVar2 = extraout_XMM0_Qa;
    }
  }
  (this->super_LPRowSetBase<double>).left.val.super__Vector_base<double,_std::allocator<double>_>.
  _M_impl.super__Vector_impl_data._M_start[i] = dVar2;
  return;
}

Assistant:

virtual void changeLhs(int i, const R& newLhs, bool scale = false)
   {
      if(scale && newLhs > R(-infinity))
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPRowSetBase<R>::lhs_w(i) = lp_scaler->scaleLhs(*this, i, newLhs);
      }
      else
         LPRowSetBase<R>::lhs_w(i) = newLhs;

      assert(isConsistent());
   }